

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O1

void list_engines(curl_slist *engines)

{
  puts("Build-time engines:");
  if (engines == (curl_slist *)0x0) {
    puts("  <none>");
    return;
  }
  do {
    curl_mprintf("  %s\n",engines->data);
    engines = engines->next;
  } while (engines != (curl_slist *)0x0);
  return;
}

Assistant:

void list_engines(const struct curl_slist *engines)
{
  puts("Build-time engines:");
  if(!engines) {
    puts("  <none>");
    return;
  }
  for(; engines; engines = engines->next)
    printf("  %s\n", engines->data);
}